

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHCurlNoGrads.cpp
# Opt level: O3

int TPZShapeHCurlNoGrads<pzshape::TPZShapeTriang>::ComputeNConnectShapeF(int icon,int order)

{
  int iVar1;
  int side;
  int nEdges;
  int nFaces;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  anon_class_32_4_863fb898 local_28;
  
  local_38 = icon + 3;
  if (order == 0) {
    iVar1 = 0;
  }
  else {
    local_34 = order;
    local_2c = pztopology::TPZTriangle::NumSides(2);
    local_30 = pztopology::TPZTriangle::NumSides(1);
    local_28.nEdges = &local_30;
    local_28.order = &local_34;
    local_28.side = &local_38;
    local_28.nFaces = &local_2c;
    iVar1 = ComputeNConnectShapeF::anon_class_32_4_863fb898::operator()(&local_28);
  }
  return iVar1;
}

Assistant:

int TPZShapeHCurlNoGrads<TSHAPE>::ComputeNConnectShapeF(const int icon, const int order)

{
    constexpr int nNodes = TSHAPE::NCornerNodes;
    const int side = icon + nNodes;
#ifdef PZDEBUG
    if (side < nNodes || side >= TSHAPE::NSides) {
        DebugStop();
    }
#endif
    //given the choice of implementation, there are no shape functions for k=0
    if(order == 0) return 0;
    const auto nFaces = TSHAPE::Dimension < 2 ? 0 : TSHAPE::NumSides(2);
    const auto nEdges = TSHAPE::NumSides(1);
    const int nShapeF = [&](){
        if (side < nNodes + nEdges) {//edge connect
          return 1;
        }
        else if(side < nNodes + nEdges + nFaces){//face connect
            switch(TSHAPE::Type(side)){
            case ETriangle://triangular face
              return (order - 1) * (order+2)/2;
            case EQuadrilateral://quadrilateral face
              // 2k(k+1)- k^2
              return order*(order+2);
            default:
              PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
              DebugStop();
              return 0;
            }
        }
        else{//internal connect (3D element only)
            if constexpr (TSHAPE::Type() == ETetraedro){
                return (order-1)*(order-2)*(2*order+3)/6;
            } else if constexpr (TSHAPE::Type() == ECube){
                return order*order*(2*order+3);
            }
            else if constexpr (TSHAPE::Type() == ECube){
              return order*order*(2*order+3);
            }
            else{
                PZError<<__PRETTY_FUNCTION__<<" error."<<std::endl;
                DebugStop();
                return 0;
            }
        }
    }();
    return nShapeF;
 }